

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_1::SyncObjectResetCase::passAndLog
          (SyncObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ostringstream *this_00;
  undefined4 uVar1;
  char *description;
  TestContext *this_01;
  bool bVar2;
  GLint syncStatus;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  (*contextReset->m_ptr->m_gl->getSynciv)
            (contextReset->m_ptr->m_sync,0x9114,4,(GLsizei *)0x0,(GLint *)local_1a0);
  uVar1 = local_1a0._0_4_;
  bVar2 = local_1a0._0_4_ != 0x9119;
  if (bVar2) {
    local_1a0._0_8_ =
         ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Test failed! glGetSynciv() returned wrong value [",0x31);
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = uVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected ",0xb);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = 0x9119;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
    this_01 = (this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Fail";
  }
  else {
    this_01 = (this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_01,(uint)bVar2,description);
  return;
}

Assistant:

virtual void passAndLog (de::SharedPtr<ContextReset>& contextReset)
	{
		const glw::GLint status = contextReset->getSyncStatus();
		if (status != GL_SIGNALED)
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message
								<< "Test failed! glGetSynciv() returned wrong value [" << glu::getErrorStr(status) << ", expected " << glu::getErrorStr(GL_SIGNALED) << "]"
								<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}